

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
::uninitialized_move_n
          (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
           *this,size_type n,size_type i,size_type j,
          btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
          *x,allocator_type *alloc)

{
  undefined8 uVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  long lVar4;
  
  slot(x,j);
  psVar2 = slot(this,i);
  psVar3 = slot(x,j);
  for (lVar4 = 0; n << 4 != lVar4; lVar4 = lVar4 + 0x10) {
    uVar1 = ((undefined8 *)((long)psVar2 + lVar4))[1];
    *(undefined8 *)((long)psVar3 + lVar4) = *(undefined8 *)((long)psVar2 + lVar4);
    ((undefined8 *)((long)psVar3 + lVar4))[1] = uVar1;
  }
  return;
}

Assistant:

void uninitialized_move_n(const size_type n, const size_type i,
                                  const size_type j, btree_node *x,
                                  allocator_type *alloc) {
            phmap::priv::SanitizerUnpoisonMemoryRegion(
                x->slot(j), n * sizeof(slot_type));
            for (slot_type *src = slot(i), *end = src + n, *dest = x->slot(j);
                 src != end; ++src, ++dest) {
                params_type::construct(alloc, dest, src);
            }
        }